

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O3

void __thiscall
ptc::Print<char>::print_backend<std::__cxx11::ostringstream&,int,char_const(&)[5],char_const(&)[8]>
          (Print<char> *this,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *os,int *first,
          char (*args) [5],char (*args_1) [8])

{
  size_type sVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  size_t sVar6;
  undefined8 uVar7;
  ANSI local_30 [2];
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)mutex_);
  if (iVar4 != 0) {
    uVar7 = std::__throw_system_error(iVar4);
    pthread_mutex_unlock((pthread_mutex_t *)mutex_);
    _Unwind_Resume(uVar7);
  }
  sVar1 = (this->pattern)._M_string_length;
  if (sVar1 == 0) {
    std::ostream::operator<<(os,*first);
  }
  else {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,(this->pattern)._M_dataplus._M_p,sVar1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*first);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,(this->pattern)._M_dataplus._M_p,(this->pattern)._M_string_length);
  }
  pcVar2 = (this->sep)._M_dataplus._M_p;
  sVar1 = (this->sep)._M_string_length;
  if ((this->pattern)._M_string_length == 0) {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,pcVar2,sVar1);
    sVar6 = strlen(*args);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,*args,sVar6);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
    sVar6 = strlen(*args_1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,*args_1,sVar6);
  }
  else {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,pcVar2,sVar1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->pattern)._M_dataplus._M_p,(this->pattern)._M_string_length);
    sVar6 = strlen(*args);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,*args,sVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,(this->pattern)._M_dataplus._M_p,(this->pattern)._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->pattern)._M_dataplus._M_p,(this->pattern)._M_string_length);
    sVar6 = strlen(*args_1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,*args_1,sVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,(this->pattern)._M_dataplus._M_p,(this->pattern)._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)os,(this->end)._M_dataplus._M_p,(this->end)._M_string_length);
  local_30[1] = 1;
  bVar3 = is_escape<char[5]>(args,local_30 + 1);
  if (!bVar3) {
    local_30[0] = generic;
    bVar3 = is_escape<char[8]>(args_1,local_30);
    if (!bVar3) goto LAB_0013f0c3;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"\x1b[0m",4);
LAB_0013f0c3:
  if (this->flush == true) {
    std::ostream::flush();
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex_);
  return;
}

Assistant:

void print_backend( T_os&& os, T&& first, Args&&... args ) const
     {
      std::lock_guard <std::mutex> lock{ mutex_ };

      // Printing the first argument
      if( is_escape( first, ANSI::first ) || pattern.empty() ) os << first;
      else os << pattern << first << pattern;
      
      // Printing all the other arguments
      if constexpr( sizeof...( args ) > 0 ) 
       {
        if ( is_escape( first, ANSI::first ) ) 
         {
          if( pattern.empty() ) ( ( os << args << sep ), ...);
          else ( ( os << pattern << args << pattern << sep ), ...);
         }
        else 
         {
          if( pattern.empty() ) ( ( os << sep << args ), ...);
          else ( ( os << sep << pattern << args << pattern ), ...);
         }
       }
      os << end;
      
      // Resetting the stream from ANSI escape sequences
      if constexpr( sizeof...( args ) > 0 )
       {
        if ( is_escape( first, ANSI::generic ) || ( ( is_escape( args, ANSI::generic ) ) || ...) )
         {
          os << "\033[0m";
         }
       }
      else 
       {
       if ( is_escape( first, ANSI::generic ) ) 
        {
         os << "\033[0m";
        }
       }

      // Other operations
      if ( flush ) os << std::flush;
     }